

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_generator.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
re2::Split_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,re2 *this,StringPiece *sep,StringPiece *s)

{
  iterator offset;
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  iterator pcVar5;
  ulong uVar6;
  iterator pcVar7;
  StringPiece *s_00;
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [32];
  StringPiece local_68;
  iterator local_58;
  char *q;
  char *p;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  StringPiece *s_local;
  StringPiece *sep_local;
  
  v.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)sep;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38);
  iVar4 = StringPiece::size((StringPiece *)this);
  if (iVar4 == 0) {
    Explode_abi_cxx11_(__return_storage_ptr__,
                       (re2 *)v.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,s_00);
  }
  else {
    q = StringPiece::begin((StringPiece *)
                           v.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_58 = StringPiece::begin((StringPiece *)
                                  v.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      pcVar7 = local_58;
      iVar4 = StringPiece::size((StringPiece *)this);
      pcVar5 = StringPiece::end((StringPiece *)
                                v.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pcVar1 = q;
      offset = local_58;
      if (pcVar5 < pcVar7 + iVar4) break;
      iVar4 = StringPiece::size((StringPiece *)this);
      StringPiece::StringPiece(&local_68,offset,iVar4);
      bVar3 = operator==(&local_68,(StringPiece *)this);
      pcVar1 = q;
      if (bVar3) {
        uVar6 = (long)local_58 - (long)q;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_88,pcVar1,uVar6,&local_89);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_38,(value_type *)local_88);
        std::__cxx11::string::~string(local_88);
        std::allocator<char>::~allocator((allocator<char> *)&local_89);
        pcVar7 = local_58;
        iVar4 = StringPiece::size((StringPiece *)this);
        q = pcVar7 + iVar4;
        local_58 = q + -1;
      }
      local_58 = local_58 + 1;
    }
    pcVar7 = StringPiece::end((StringPiece *)
                              v.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pcVar2 = q;
    if (pcVar1 < pcVar7) {
      pcVar7 = StringPiece::end((StringPiece *)
                                v.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar6 = (long)pcVar7 - (long)q;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,pcVar2,uVar6,&local_b1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_38,(value_type *)local_b0);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38);
  }
  p._0_4_ = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return __return_storage_ptr__;
}

Assistant:

vector<string> Split(const StringPiece& sep, const StringPiece& s) {
  vector<string> v;

  if (sep.size() == 0)
    return Explode(s);

  const char *p = s.begin();
  for (const char *q = s.begin(); q + sep.size() <= s.end(); q++) {
    if (StringPiece(q, sep.size()) == sep) {
      v.push_back(string(p, q - p));
      p = q + sep.size();
      q = p - 1;  // -1 for ++ in loop
      continue;
    }
  }
  if (p < s.end())
    v.push_back(string(p, s.end() - p));
  return v;
}